

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void __thiscall
Imath_3_2::Matrix33<float>::Matrix33<double>(Matrix33<float> *this,Matrix33<double> *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = v->x[0][1];
  dVar2 = v->x[0][2];
  dVar3 = v->x[1][0];
  this->x[0][0] = (float)v->x[0][0];
  this->x[0][1] = (float)dVar1;
  this->x[0][2] = (float)dVar2;
  this->x[1][0] = (float)dVar3;
  dVar1 = v->x[1][2];
  dVar2 = v->x[2][0];
  dVar3 = v->x[2][1];
  this->x[1][1] = (float)v->x[1][1];
  this->x[1][2] = (float)dVar1;
  this->x[2][0] = (float)dVar2;
  this->x[2][1] = (float)dVar3;
  this->x[2][2] = (float)v->x[2][2];
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>::Matrix33 (
    const Matrix33<S>& v) IMATH_NOEXCEPT
{
    x[0][0] = T (v.x[0][0]);
    x[0][1] = T (v.x[0][1]);
    x[0][2] = T (v.x[0][2]);
    x[1][0] = T (v.x[1][0]);
    x[1][1] = T (v.x[1][1]);
    x[1][2] = T (v.x[1][2]);
    x[2][0] = T (v.x[2][0]);
    x[2][1] = T (v.x[2][1]);
    x[2][2] = T (v.x[2][2]);
}